

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall ParserTestEmpty::Run(ParserTestEmpty *this)

{
  int iVar1;
  int iVar2;
  int fail_count;
  ParserTestEmpty *this_local;
  
  iVar1 = testing::Test::AssertionFailures(g_current_test);
  ParserTest::AssertParse(&this->super_ParserTest,"");
  iVar2 = testing::Test::AssertionFailures(g_current_test);
  if (iVar1 != iVar2) {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(ParserTest, Empty) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(""));
}